

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O2

int ffgbyt(fitsfile *fptr,LONGLONG nbytes,void *buffer,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  size_t sVar5;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar1 = fptr->Fptr;
  if (nbytes < 0x21c0) {
    iVar2 = pFVar1->curbuf;
    if (iVar2 < 0) {
      ffldrc(fptr,pFVar1->bytepos / 0xb40,0,status);
      pFVar1 = fptr->Fptr;
      iVar2 = pFVar1->curbuf;
    }
    lVar4 = pFVar1->bufrecnum[iVar2] * -0xb40 + pFVar1->bytepos;
    sVar5 = 0xb40 - lVar4;
    while (nbytes != 0) {
      __n = sVar5;
      if (nbytes < (long)sVar5) {
        __n = nbytes;
      }
      memcpy(buffer,fptr->Fptr->iobuffer + lVar4 + (long)fptr->Fptr->curbuf * 0xb40,__n);
      buffer = (void *)((long)buffer + __n);
      lVar3 = fptr->Fptr->bytepos + __n;
      fptr->Fptr->bytepos = lVar3;
      nbytes = nbytes - __n;
      if (nbytes != 0) {
        sVar5 = 0xb40;
        ffldrc(fptr,lVar3 / 0xb40,0,status);
        lVar4 = 0;
      }
    }
  }
  else {
    lVar4 = pFVar1->bytepos;
    for (lVar3 = 0; pFVar1 = fptr->Fptr, lVar3 != 0x28; lVar3 = lVar3 + 1) {
      if (((pFVar1->dirty[lVar3] != 0) && (lVar4 / 0xb40 <= pFVar1->bufrecnum[lVar3])) &&
         (pFVar1->bufrecnum[lVar3] <= (lVar4 + nbytes + -1) / 0xb40)) {
        ffbfwt(pFVar1,(int)lVar3,status);
      }
    }
    if (pFVar1->io_pos != lVar4) {
      ffseek(pFVar1,lVar4);
      pFVar1 = fptr->Fptr;
    }
    ffread(pFVar1,nbytes,buffer,status);
    fptr->Fptr->io_pos = lVar4 + nbytes;
  }
  return *status;
}

Assistant:

int ffgbyt(fitsfile *fptr,    /* I - FITS file pointer             */
           LONGLONG nbytes,       /* I - number of bytes to read       */
           void *buffer,      /* O - buffer to read into           */
           int *status)       /* IO - error status                 */
/*
  get (read) the requested number of bytes from the file, starting at
  the current file position.  Read large blocks of data directly from disk;
  read smaller segments via intermediate IO buffers to improve efficiency.
*/
{
    int ii;
    LONGLONG filepos;
    long recstart, recend, ntodo, bufpos, nspace, nread;
    char *cptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    cptr = (char *)buffer;

    if (nbytes >= MINDIRECT)
    {
      /* read large blocks of data directly from disk instead of via buffers */
      filepos = (fptr->Fptr)->bytepos; /* save the read starting position */

/*  note that in this case, ffmbyt has not been called, and so        */
/*  bufrecnum[(fptr->Fptr)->curbuf] does not point to the intended */
/*  output buffer */

      recstart = (long) (filepos / IOBUFLEN);               /* starting record */
      recend = (long) ((filepos + nbytes - 1) / IOBUFLEN);  /* ending record   */

      for (ii = 0; ii < NIOBUF; ii++) /* flush any affected buffers to disk */
      {
        if ((fptr->Fptr)->dirty[ii] && 
            (fptr->Fptr)->bufrecnum[ii] >= recstart && (fptr->Fptr)->bufrecnum[ii] <= recend)
            {
              ffbfwt(fptr->Fptr, ii, status);    /* flush modified buffer to disk */
            }
      }

       /* move to the correct read position */
      if ((fptr->Fptr)->io_pos != filepos)
         ffseek(fptr->Fptr, filepos);

      ffread(fptr->Fptr, (long) nbytes, cptr, status); /* read the data */
      (fptr->Fptr)->io_pos = filepos + nbytes; /* update the file position */
    }
    else
    {
      /* read small chucks of data using the IO buffers for efficiency */

      if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
      {                              /* so reload the last one that was used */
        ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
      }

      /* bufpos is the starting position in IO buffer */
      bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)(fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf] *
                IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      ntodo =  (long) nbytes;
      while (ntodo)
      {
        nread  = minvalue(ntodo, nspace);

        /* copy bytes from IO buffer to user's buffer */
        memcpy(cptr, (fptr->Fptr)->iobuffer + ((fptr->Fptr)->curbuf * IOBUFLEN) + bufpos, nread);
        ntodo -= nread;            /* decrement remaining number of bytes */
        cptr  += nread;
        (fptr->Fptr)->bytepos += nread;    /* increment file position pointer */

        if (ntodo)                  /* load next record into a buffer */
        {
          ffldrc(fptr, (long) ((fptr->Fptr)->bytepos / IOBUFLEN), REPORT_EOF, status);
          bufpos = 0;
          nspace = IOBUFLEN;
        }
      }
    }

    return(*status);
}